

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SimpleArray<ON_SubDEdgePtr> *unsorted_edges,uint minimum_chain_length,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges,bool bIgnoreCorners)

{
  ON_SubDEdgePtrLink *pOVar1;
  char cVar2;
  ON__UINT_PTR OVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  ON_SubDEdgePtr *pOVar14;
  ON_SubDVertex *v;
  long lVar15;
  long lVar16;
  char cVar17;
  uint uVar18;
  long lVar19;
  ON_SubDEdge *edge;
  ulong uVar20;
  long lVar21;
  ON_SubDEdgePtrLink *pOVar22;
  ulong uVar23;
  byte bVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  ON_SimpleArray<ON_SubDEdgePtr> chain;
  ON_SimpleArray<ON_SubDEdgePtrLink> links;
  ON_SimpleArray<ON_SubDEdgePtr> tail;
  ON_SubDEdgePtrLink epl1;
  ON_SimpleArray<ON_SubDEdgePtr> local_b0;
  ON_SubDEdgePtrLink local_98;
  ulong local_88;
  ON_SimpleArray<ON_SubDEdgePtrLink> local_80;
  uint local_64;
  ON_SimpleArray<ON_SubDEdgePtr> local_60;
  ON_SubDEdgePtr local_48;
  ulong uStack_40;
  _func_int **local_38;
  
  uVar9 = unsorted_edges->m_count;
  if ((ulong)uVar9 == 0) {
    uVar9 = 0;
    if (-1 < sorted_edges->m_capacity) {
      sorted_edges->m_count = 0;
    }
  }
  else {
    local_80._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00828eb0;
    local_80.m_a = (ON_SubDEdgePtrLink *)0x0;
    local_80.m_count = 0;
    local_80.m_capacity = 0;
    local_64 = minimum_chain_length;
    if (uVar9 * 2 != 0) {
      ON_SimpleArray<ON_SubDEdgePtrLink>::SetCapacity(&local_80,(ulong)(uVar9 * 2));
    }
    local_98.m_ep = (ON_SubDEdgePtr)0;
    local_98.m_index = 0;
    local_98.m_nbr_index = 0xffffffff;
    uVar23 = 1;
    if (1 < uVar9) {
      uVar23 = (ulong)uVar9;
    }
    uVar25 = 0;
    local_88 = (ulong)uVar9;
    do {
      uVar13 = unsorted_edges->m_a[uVar25].m_ptr;
      uVar11 = uVar13 & 0xfffffffffffffff8;
      if (((uVar11 != 0) && (*(long *)(uVar11 + 0x80) != 0)) &&
         (*(long *)(uVar11 + 0x80) != *(long *)(uVar11 + 0x88) && *(long *)(uVar11 + 0x88) != 0)) {
        local_98.m_ep.m_ptr = uVar13 & 0xfffffffffffffff9 ^ 1;
        ON_SimpleArray<ON_SubDEdgePtrLink>::Append(&local_80,&local_98);
        local_98.m_ep.m_ptr = uVar13;
        local_98.m_index = local_98.m_index + 1;
        ON_SimpleArray<ON_SubDEdgePtrLink>::Append(&local_80,&local_98);
        local_98.m_index = local_98.m_index + 1;
      }
      uVar25 = uVar25 + 1;
    } while (uVar23 != uVar25);
    if (-1 < (long)sorted_edges->m_capacity) {
      sorted_edges->m_count = 0;
    }
    if ((ulong)(long)sorted_edges->m_capacity < local_88) {
      ON_SimpleArray<ON_SubDEdgePtr>::SetCapacity(sorted_edges,local_88);
    }
    if (local_80.m_a != (ON_SubDEdgePtrLink *)0x0) {
      if (1 < (long)local_80.m_count) {
        ON_qsort(local_80.m_a,(long)local_80.m_count,0x10,ON_SubDEdgePtrLink::CompareVertex);
      }
    }
    uVar6 = local_80._16_8_;
    iVar5 = local_80.m_count;
    uVar23 = local_80._16_8_ & 0xffffffff;
    if (uVar23 != 0) {
      uVar25 = 0;
      do {
        uVar11 = uVar25 & 0xffffffff;
        uVar13 = local_80.m_a[uVar11].m_ep.m_ptr;
        uVar20 = uVar13 & 0xfffffffffffffff8;
        uVar9 = (uint)uVar13;
        if (uVar20 == 0) {
          v = (ON_SubDVertex *)0x0;
        }
        else {
          v = *(ON_SubDVertex **)(uVar20 + 0x80 + (ulong)(uVar9 & 1) * 8);
        }
        uVar7 = (uint)uVar25;
        uVar18 = uVar7 + 1;
        uVar25 = (ulong)uVar18;
        if (uVar18 < (uint)iVar5) {
          uVar25 = (ulong)uVar18;
          pOVar22 = local_80.m_a + uVar25;
          do {
            if (uVar20 == 0) {
              lVar15 = 0;
            }
            else {
              lVar15 = *(long *)(uVar20 + 0x80 + (ulong)(uVar9 & 1) * 8);
            }
            uVar13 = (pOVar22->m_ep).m_ptr;
            uVar26 = uVar13 & 0xfffffffffffffff8;
            if (uVar26 == 0) {
              lVar16 = 0;
            }
            else {
              lVar16 = *(long *)(uVar26 + 0x80 + (ulong)((uint)uVar13 & 1) * 8);
            }
            if (lVar15 != lVar16) goto LAB_005f9e47;
            uVar25 = uVar25 + 1;
            pOVar22 = pOVar22 + 1;
          } while (uVar23 != uVar25);
          uVar25 = uVar6 & 0xffffffff;
        }
LAB_005f9e47:
        uVar9 = (uint)uVar25;
        if (v == (ON_SubDVertex *)0x0) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                     ,0x6a48,"","Bug in code that creates the links[] array.");
        }
        else if ((bIgnoreCorners) || (v->m_vertex_tag != Corner)) {
          pOVar22 = local_80.m_a + uVar11;
          if (uVar18 == uVar9) {
            pOVar22->m_nbr_index = 0xfffffffe;
          }
          else if (uVar7 + 2 == uVar9) {
            pOVar22->m_nbr_index = local_80.m_a[uVar18].m_index;
            local_80.m_a[uVar18].m_nbr_index = pOVar22->m_index;
          }
          else {
            ON_SubDEdgePtrLink::Resolve3OrMoreEdges(0xfffffffe,uVar9 - uVar7,v,pOVar22);
          }
        }
        else if (uVar7 < uVar9) {
          puVar12 = &local_80.m_a[uVar11].m_nbr_index;
          lVar15 = (uVar25 & 0xffffffff) - uVar11;
          do {
            *puVar12 = 0xfffffffe;
            puVar12 = puVar12 + 4;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
      } while (uVar9 < (uint)iVar5);
    }
    if (local_80.m_a != (ON_SubDEdgePtrLink *)0x0) {
      if (1 < (long)local_80.m_count) {
        ON_qsort(local_80.m_a,(long)local_80.m_count,0x10,ON_SubDEdgePtrLink::CompareIndex);
      }
    }
    pOVar22 = local_80.m_a;
    local_b0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00825d08;
    local_b0.m_a = (ON_SubDEdgePtr *)0x0;
    local_b0.m_count = 0;
    local_b0.m_capacity = 0;
    ON_SimpleArray<ON_SubDEdgePtr>::SetCapacity(&local_b0,local_88);
    if (uVar23 == 0) {
      uVar9 = 0;
    }
    else {
      local_38 = (_func_int **)&PTR__ON_SimpleArray_00825d08;
      uVar9 = 0;
      uVar23 = 0;
      do {
        uVar25 = pOVar22[uVar23].m_ep.m_ptr;
        uVar13._0_4_ = pOVar22[uVar23].m_index;
        uVar13._4_4_ = pOVar22[uVar23].m_nbr_index;
        pOVar22[uVar23].m_ep.m_ptr = 0;
        uVar7 = (uint)uVar23 | 1;
        pOVar1 = pOVar22 + uVar7;
        local_48.m_ptr = (pOVar1->m_ep).m_ptr;
        uStack_40._0_4_ = pOVar1->m_index;
        uStack_40._4_4_ = pOVar1->m_nbr_index;
        pOVar22[uVar7].m_ep.m_ptr = 0;
        iVar8 = 0xf;
        if (7 < uVar25) {
          local_98.m_ep.m_ptr = local_48.m_ptr;
          local_98._8_8_ = uStack_40;
          if (-1 < (long)local_b0._16_8_) {
            local_b0._16_8_ = local_b0._16_8_ & 0xffffffff00000000;
          }
          while( true ) {
            uVar11 = (ulong)local_98.m_nbr_index;
            if (0x7ffffffe < local_98.m_nbr_index >> 1) break;
            uVar7 = (-(local_98.m_nbr_index & 1) | 1) + local_98.m_nbr_index;
            pOVar1 = pOVar22 + uVar7;
            uVar20 = (pOVar1->m_ep).m_ptr;
            local_98.m_index = pOVar1->m_index;
            local_98.m_nbr_index = pOVar1->m_nbr_index;
            pOVar22[uVar11].m_ep.m_ptr = 0;
            pOVar22[uVar7].m_ep.m_ptr = 0;
            local_98.m_ep.m_ptr = uVar20;
            if ((uVar20 < 8) ||
               (ON_SimpleArray<ON_SubDEdgePtr>::Append(&local_b0,&local_98.m_ep), uVar20 < 8))
            break;
          }
          bVar27 = (local_b0._16_8_ & 0xffffffff) != 0;
          bVar28 = local_98.m_index == (uint)uStack_40;
          bVar29 = false;
          if ((!bVar28 || !bVar27) && (0xfffffffd < local_98.m_nbr_index)) {
            bVar29 = (local_98._8_8_ & 1) == 0;
          }
          if (1 < local_b0.m_count && local_98.m_index != (uint)uStack_40) {
            lVar16 = 0;
            lVar15 = (local_b0._16_8_ & 0xffffffff) - 2;
            do {
              OVar3 = local_b0.m_a[lVar16].m_ptr;
              local_b0.m_a[lVar16].m_ptr = local_b0.m_a[lVar15 + 1].m_ptr;
              local_b0.m_a[lVar15 + 1].m_ptr = OVar3;
              lVar16 = lVar16 + 1;
              bVar4 = lVar16 < lVar15;
              lVar15 = lVar15 + -1;
            } while (bVar4);
          }
          ON_SimpleArray<ON_SubDEdgePtr>::Append(&local_b0,&local_48);
          if (bVar28 && bVar27) {
            if (1 < (long)local_b0.m_count) {
              lVar16 = 0;
              lVar15 = (long)local_b0.m_count + -2;
              do {
                OVar3 = local_b0.m_a[lVar16].m_ptr;
                local_b0.m_a[lVar16].m_ptr = local_b0.m_a[lVar15 + 1].m_ptr;
                local_b0.m_a[lVar15 + 1].m_ptr = OVar3;
                lVar16 = lVar16 + 1;
                bVar4 = lVar16 < lVar15;
                lVar15 = lVar15 + -1;
              } while (bVar4);
            }
            bVar24 = 0;
            cVar17 = bVar28 && bVar27;
          }
          else {
            local_88 = CONCAT71(local_88._1_7_,bVar28 && bVar27);
            local_98.m_ep.m_ptr = uVar25;
            local_98._8_8_ = uVar13;
            do {
              uVar25 = (ulong)local_98.m_nbr_index;
              if (0x7ffffffe < local_98.m_nbr_index >> 1) break;
              uVar7 = (-(local_98.m_nbr_index & 1) | 1) + local_98.m_nbr_index;
              pOVar1 = pOVar22 + uVar7;
              uVar13 = (pOVar1->m_ep).m_ptr;
              local_98.m_index = pOVar1->m_index;
              local_98.m_nbr_index = pOVar1->m_nbr_index;
              pOVar22[uVar25].m_ep.m_ptr = 0;
              pOVar22[uVar7].m_ep.m_ptr = 0;
              local_98.m_ep.m_ptr = uVar13;
              if (uVar13 < 8) break;
              local_60._vptr_ON_SimpleArray = (_func_int **)(uVar13 & 0xfffffffffffffff9 ^ 1);
              ON_SimpleArray<ON_SubDEdgePtr>::Append(&local_b0,(ON_SubDEdgePtr *)&local_60);
            } while (7 < uVar13);
            bVar24 = (byte)local_98.m_index & 1 ^ 1;
            if ((bool)((local_98._8_8_ & 1) == 0 & bVar29)) {
              ReverseEdgeChain(local_b0.m_a,local_b0._16_8_ & 0xffffffff);
            }
            cVar17 = (char)local_88;
          }
          iVar8 = local_b0.m_count;
          uVar25 = local_b0._16_8_ & 0xffffffff;
          if (uVar25 != 0) {
            if (2 < (uint)local_b0.m_count) {
              uVar13 = (local_b0.m_a)->m_ptr & 0xfffffffffffffff8;
              if (uVar13 == 0) {
                lVar15 = 0;
              }
              else {
                lVar15 = *(long *)(uVar13 + 0x80 + (ulong)((uint)(local_b0.m_a)->m_ptr & 1) * 8);
              }
              if ((lVar15 != 0) && (*(char *)(lVar15 + 0x60) != '\x03')) {
                uVar11 = local_b0.m_a[local_b0.m_count - 1].m_ptr & 0xfffffffffffffff8;
                if (uVar11 == 0) {
                  lVar16 = 0;
                }
                else {
                  lVar16 = *(long *)(uVar11 + 0x80 +
                                    (ulong)(~(uint)local_b0.m_a[local_b0.m_count - 1].m_ptr & 1) * 8
                                    );
                }
                if (((lVar15 == lVar16) && (uVar13 != 0)) && (uVar11 != 0)) {
                  cVar2 = *(char *)(uVar13 + 0x60);
                  bVar27 = cVar2 == '\x01' || cVar2 == '\x04';
                  if ((bVar27 == (*(char *)(uVar11 + 0x60) == '\x04' ||
                                 *(char *)(uVar11 + 0x60) == '\x01')) &&
                     (((cVar2 != '\x04' && (cVar2 != '\x01')) ||
                      (*(char *)(lVar15 + 0x60) != '\x02')))) {
                    uVar13 = 2;
                    if (2 < (uint)local_b0.m_count) {
                      uVar13 = local_b0._16_8_ & 0xffffffff;
                    }
                    uVar11 = 1;
LAB_005fa42c:
                    uVar20 = local_b0.m_a[uVar11].m_ptr & 0xfffffffffffffff8;
                    if ((uVar20 != 0) &&
                       (lVar15 = *(long *)(uVar20 + 0x80 +
                                          (ulong)((uint)local_b0.m_a[uVar11].m_ptr & 1) * 8),
                       lVar15 != 0)) {
                      if ((bVar27 == (*(char *)(uVar20 + 0x60) == '\x04' ||
                                     *(char *)(uVar20 + 0x60) == '\x01')) &&
                         (((cVar2 != '\x04' && (cVar2 != '\x01')) ||
                          ((*(byte *)(lVar15 + 0x60) & 0xfe) != 2)))) goto LAB_005fa48e;
                      local_60._vptr_ON_SimpleArray = local_38;
                      local_60.m_a = (ON_SubDEdgePtr *)0x0;
                      local_60.m_count = 0;
                      local_60.m_capacity = 0;
                      local_88 = uVar11;
                      ON_SimpleArray<ON_SubDEdgePtr>::Append(&local_60,(int)uVar11,local_b0.m_a);
                      pOVar14 = local_b0.m_a;
                      uVar13 = local_88;
                      if ((uint)local_88 < (uint)iVar8) {
                        do {
                          pOVar14->m_ptr = local_b0.m_a[uVar13].m_ptr;
                          uVar13 = uVar13 + 1;
                          pOVar14 = pOVar14 + 1;
                        } while (uVar25 != uVar13);
                      }
                      iVar10 = iVar8 - (uint)local_88;
                      if ((-1 < iVar10) && (iVar10 <= local_b0.m_capacity)) {
                        local_b0.m_count = iVar10;
                      }
                      ON_SimpleArray<ON_SubDEdgePtr>::Append
                                (&local_b0,local_60.m_count,local_60.m_a);
                      ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&local_60);
                    }
                  }
                }
              }
            }
LAB_005fa204:
            uVar25 = local_b0._16_8_ & 0xffffffff;
            if (local_64 <= (uint)local_b0.m_count) {
              uVar13 = (local_b0.m_a)->m_ptr & 0xfffffffffffffff8;
              if (uVar13 == 0) {
                lVar15 = 0;
              }
              else {
                lVar15 = *(long *)(uVar13 + 0x80 + (ulong)((uint)(local_b0.m_a)->m_ptr & 1) * 8);
              }
              iVar10 = sorted_edges->m_count;
              pOVar14 = sorted_edges->m_a;
              if (pOVar14 + (long)iVar10 + -1 == (ON_SubDEdgePtr *)0x0 || (long)iVar10 < 1) {
LAB_005fa272:
                lVar16 = 0;
              }
              else {
                uVar13 = pOVar14[(long)iVar10 + -1].m_ptr;
                uVar11 = uVar13 & 0xfffffffffffffff8;
                if (uVar11 == 0) goto LAB_005fa272;
                lVar16 = *(long *)(uVar11 + 0x80 + (ulong)(~(uint)uVar13 & 1) * 8);
              }
              if ((lVar15 == 0) || (lVar15 != lVar16)) {
                ON_SimpleArray<ON_SubDEdgePtr>::Append(sorted_edges,local_b0.m_count,local_b0.m_a);
              }
              else {
                uVar13 = local_b0.m_a[iVar8 - 1].m_ptr & 0xfffffffffffffff8;
                if (uVar13 == 0) {
                  lVar21 = 0;
                }
                else {
                  lVar21 = *(long *)(uVar13 + 0x80 +
                                    (ulong)(~(uint)local_b0.m_a[iVar8 - 1].m_ptr & 1) * 8);
                }
                if (pOVar14 == (ON_SubDEdgePtr *)0x0 || iVar10 < 1) {
LAB_005fa2da:
                  lVar19 = 0;
                }
                else {
                  uVar13 = pOVar14->m_ptr & 0xfffffffffffffff8;
                  if (uVar13 == 0) goto LAB_005fa2da;
                  lVar19 = *(long *)(uVar13 + 0x80 + (ulong)((uint)pOVar14->m_ptr & 1) * 8);
                }
                if (lVar21 == lVar19) {
                  if (lVar21 == lVar16 || cVar17 != '\0') {
LAB_005fa371:
                    if (cVar17 != '\0' || lVar15 == lVar19) {
LAB_005fa49b:
                      if (lVar21 == lVar16 || cVar17 != '\0') {
                        if (cVar17 != '\0' || lVar15 == lVar19) {
                          ON_SimpleArray<ON_SubDEdgePtr>::Append
                                    (sorted_edges,local_b0.m_count,local_b0.m_a);
                          goto LAB_005fa2f7;
                        }
                        ReverseEdgeChain(local_b0.m_a,uVar25);
                        ON_SimpleArray<ON_SubDEdgePtr>::Prepend
                                  (sorted_edges,local_b0.m_count,local_b0.m_a);
                      }
                      else {
                        ReverseEdgeChain(local_b0.m_a,uVar25);
                        ON_SimpleArray<ON_SubDEdgePtr>::Append
                                  (sorted_edges,local_b0.m_count,local_b0.m_a);
                      }
                    }
                    else {
                      if (bVar29) {
                        if (bVar24 != 0) {
                          if (bVar29) goto LAB_005fa49b;
                          goto LAB_005fa396;
                        }
                      }
                      else {
LAB_005fa396:
                        if (bVar24 == 0) goto LAB_005fa49b;
                      }
                      ReverseEdgeChain(local_b0.m_a,uVar25);
                      ON_SimpleArray<ON_SubDEdgePtr>::Prepend
                                (sorted_edges,local_b0.m_count,local_b0.m_a);
                    }
                  }
                  else {
                    if (bVar29) {
                      if (bVar24 != 0) {
                        if (bVar29) goto LAB_005fa371;
                        goto LAB_005fa34c;
                      }
                    }
                    else {
LAB_005fa34c:
                      if (bVar24 == 0) goto LAB_005fa371;
                    }
                    ReverseEdgeChain(local_b0.m_a,uVar25);
                    ON_SimpleArray<ON_SubDEdgePtr>::Append
                              (sorted_edges,local_b0.m_count,local_b0.m_a);
                  }
                }
                else {
                  ON_SimpleArray<ON_SubDEdgePtr>::Prepend
                            (sorted_edges,local_b0.m_count,local_b0.m_a);
                }
              }
              uVar9 = uVar9 + 1;
            }
          }
LAB_005fa2f7:
          iVar8 = 0;
          if (iVar5 == sorted_edges->m_count * 2) {
            iVar8 = 0xd;
          }
        }
      } while (((iVar8 == 0xf) || (iVar8 == 0)) &&
              (uVar7 = (uint)uVar23 + 2, uVar23 = (ulong)uVar7, uVar7 < (uint)iVar5));
    }
    ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&local_b0);
    ON_SimpleArray<ON_SubDEdgePtrLink>::~ON_SimpleArray(&local_80);
  }
  return uVar9;
LAB_005fa48e:
  uVar11 = uVar11 + 1;
  if (uVar13 == uVar11) goto LAB_005fa204;
  goto LAB_005fa42c;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SimpleArray< ON_SubDEdgePtr >& unsorted_edges,
  unsigned int minimum_chain_length,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges,
  const bool bIgnoreCorners
)
{
  // NOTE:
  //  unsorted_edges[] and sorted_edges[] may reference the same array.
  ////const ON_SubDEdge* ee[2] = {};
  ////const ON_SubDVertex* vv[2] = {};

  const unsigned int unsorted_edge_count = unsorted_edges.Count();
  if (unsorted_edge_count <= 0)
  {
    sorted_edges.SetCount(0);
    return 0;
  }

  ON_SimpleArray< ON_SubDEdgePtrLink > links(2*unsorted_edge_count);
  const unsigned int unset_nbr1_index = 0xFFFFFFFEU;
  const unsigned int unset_nbrX_index = unset_nbr1_index+1;
  ON_SubDEdgePtrLink epl;
  epl.m_nbr_index = unset_nbrX_index;
  for (unsigned int i = 0; i < unsorted_edge_count; i++)
  {
    ON_SubDEdgePtr ep = unsorted_edges[i];
    const ON_SubDEdge* e = ep.Edge();
    if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1] || e->m_vertex[0] == e->m_vertex[1])
      continue;

    // unsorted_edges[i] has 2 links with m_index = 2*i and m_index = 2*+1.

    // links with even m_index have opposite orientation as unsorted_edges[].
    // links[2*i].m_ep.RelativeVertex(0) = unsorted_edges[i].RelativeVertex(1)
    epl.m_ep = ep.Reversed();
    links.Append(epl);
    ++epl.m_index;
    ////ee[0] = epl.m_ep.Edge();
    ////vv[1] = epl.m_ep.RelativeVertex(0);

    // links with odd m_index have same orientation as unsorted_edges[].
    // links[2*i+1].m_ep.RelativeVertex(0) = unsorted_edges[i].RelativeVertex(0)
    epl.m_ep = ep;
    links.Append(epl);
    ++epl.m_index;
    ////ee[1] = epl.m_ep.Edge();
    ////vv[0] = epl.m_ep.RelativeVertex(0);
    ////if (e != ee[0] || e != ee[1] || vv[0] == vv[1])
    ////  return false;
  }

  // NOTE:
  // unsorted_edges[] and sorted_edges[] may reference the same array.
  // At this point, I'm finished with unsorted_edges[] so it's ok to 
  // modify sorted_edges[] here.
  sorted_edges.SetCount(0);
  sorted_edges.Reserve(unsorted_edge_count);

  // sort links by ON_SubDEdgePtr.RelativeVertex(0) and set m_nbr_index
  links.QuickSort(ON_SubDEdgePtrLink::CompareVertex);
  // link_count = even number
  const unsigned int link_count = links.UnsignedCount();
  unsigned int i1 = link_count;
  for (unsigned int i0 = 0; i0 < link_count; i0 = i1)
  {
    ON_SubDEdgePtrLink& epl0 = links[i0];
    const ON_SubDVertex* v = epl0.m_ep.RelativeVertex(0);
    for (i1 = i0 + 1; i1 < link_count; ++i1)
    {
      if (0 != ON_SubDEdgePtrLink::CompareVertex(&epl0, &links[i1]))
        break;
    }
    if (nullptr == v)
    {
      ON_SUBD_ERROR("Bug in code that creates the links[] array.");
      continue;
    }
    if (!bIgnoreCorners)
    {
      if (v->IsCorner())
      {
        // These edges will be at the ends of chains.
        while (i0 < i1)
          links[i0++].m_nbr_index = unset_nbr1_index;
        continue;
      }
    }

    if (i0 + 1 == i1)
    {
      // The vertex is referenced by exactly 1 edge in unsorted_edges[]
      // This edge will appear in sorted_edges[] at the start or end of a chain.
      epl0.m_nbr_index = unset_nbr1_index;
      continue; 
    }
    if (i0 + 2 == i1)
    {
      // This vertex is referenced by exactly 2 edges in  unsorted_edges[].
      // The vertex will be in the interior of a chain and the edges will 
      // appear in sorted_edges[] next to each other in the same chain.
      ON_SubDEdgePtrLink& epl1 = links[i0 + 1];
      epl0.m_nbr_index = epl1.m_index;
      epl1.m_nbr_index = epl0.m_index;
      continue;
    }

    // The vertex referenced by 3 or more edges in unsorted_edges[].
    // If the case cannot be resolved by Resolve3OrMoreEdges(), 
    // then this vertex will not be in the interior of a chain.
    ON_SubDEdgePtrLink::Resolve3OrMoreEdges(
      unset_nbr1_index,
      i1 - i0,
      v,
      links.Array() + i0
    );
  }

  // Sort links[] by m_index value to restore links[] to its original order.
  links.QuickSort(ON_SubDEdgePtrLink::CompareIndex);
  ON_SubDEdgePtrLink* links_array = links.Array();

  unsigned chain_count = 0;
  ON_SimpleArray<ON_SubDEdgePtr> chain(unsorted_edge_count);

  for (unsigned int i = 0; i < link_count; ++i)
  {
    // epl0 and epl1 are the links for edges[i/2]
    const ON_SubDEdgePtrLink epl0 = links_array[i];
    links_array[i].m_ep = ON_SubDEdgePtr::Null;
    const ON_SubDEdgePtrLink epl1 = links_array[++i];
    links_array[i].m_ep = ON_SubDEdgePtr::Null;

    if (nullptr == epl0.m_ep.Edge())
      continue; // this edge has already been inserted in sorted_edges[].

    chain.SetCount(0);

    // Add edges that come "before" edges[i/2] to chain[]
    epl = epl1;
    for (;;)
    {
      if (epl.m_nbr_index >= unset_nbr1_index)
        break;
      unsigned int j = epl.m_nbr_index;
      unsigned int j1 = (0 == (j % 2)) ? (j + 1) : (j - 1);
      // epl = "previous" link
      epl = links_array[j1];
      links_array[j].m_ep = ON_SubDEdgePtr::Null;
      links_array[j1].m_ep = ON_SubDEdgePtr::Null;
      if (nullptr == epl.m_ep.Edge())
        break;
      ////ee[0] = epl.m_ep.Edge();
      ////vv[0] = epl.m_ep.RelativeVertex(0);
      ////vv[1] = epl.m_ep.RelativeVertex(1);
      ////if (vv[0] == vv[1] || nullptr == ee[0])
      ////  return false;
      chain.Append(epl.m_ep);
    }

    const bool bClosedChain =
        chain.UnsignedCount() > 0 && (epl.m_index == epl1.m_index);
    const bool bFirstEdgeIsReversed = !bClosedChain &&
                                      unset_nbr1_index <= epl.m_nbr_index &&
                                      (0 == (epl.m_index % 2));
    bool bLastEdgeIsReversed{false};
    if (false == bClosedChain)
    {
      chain.Reverse();
    }

    ////ee[0] = epl1.m_ep.Edge();
    ////vv[0] = epl1.m_ep.RelativeVertex(0);
    ////vv[1] = epl1.m_ep.RelativeVertex(1);
    ////if (vv[0] == vv[1] || nullptr == ee[0])
    ////  return false;
    chain.Append(epl1.m_ep); // matches input edge orientation

    if (bClosedChain)
    {
      // put edges[i/2] at the start of the closed chain.
      chain.Reverse();
    }
    else
    {
      // Add edges that come "after" edges[i/2] to chain[]
      epl = epl0;
      for (;;)
      {
        if (epl.m_nbr_index >= unset_nbr1_index)
          break;
        unsigned int j = epl.m_nbr_index;
        unsigned int j1 = (0 == (j % 2)) ? (j + 1) : (j - 1);
        // epl = "next" link
        epl = links_array[j1];
        links_array[j].m_ep = ON_SubDEdgePtr::Null;
        links_array[j1].m_ep = ON_SubDEdgePtr::Null;
        if (nullptr == epl.m_ep.Edge())
          break;
        ////ee[0] = epl.m_ep.Edge();
        ////vv[0] = epl.m_ep.RelativeVertex(1);
        ////vv[1] = epl.m_ep.RelativeVertex(0);
        ////if (vv[0] == vv[1] || nullptr == ee[0])
        ////  return false;
        chain.Append(epl.m_ep.Reversed());
      }

      // No need to update bClosedChain here: if it was closed, then the circle
      // was found with the edges "before" edges[i/2]

      // First and last edge are reversed: reverse chain direction to keep first
      // edge direction the same as in unsorted_edges
      bLastEdgeIsReversed = epl.m_index % 2 == 0;
      if (bFirstEdgeIsReversed && bLastEdgeIsReversed) {
        ReverseEdgeChain(chain);
      }
    }

    const unsigned int chain_edge_count = chain.UnsignedCount();
    if (chain_edge_count > 0)
    {
      for (;;)
      {
        if (chain_edge_count < 3)
          break;
        const ON_SubDVertex* c0 = chain[0].RelativeVertex(0);
        if (nullptr == c0)
          break;
        if (c0->IsCorner())
          break;
        const ON_SubDVertex* c1 = chain[chain_edge_count-1].RelativeVertex(1);
        if (c0 != c1)
          break;
        const ON_SubDEdge* e0 = chain[0].Edge();
        if (nullptr == e0)
          break;
        const ON_SubDEdge* e1 = chain[chain_edge_count-1].Edge();
        if (nullptr == e1)
          break;
        const bool bSmooth = e0->IsSmooth();
        if (bSmooth != e1->IsSmooth())
          break;
        if (bSmooth && c0->IsCrease())
          break;
        // Check for an embedded crease vertex.
        for (unsigned int k = 1; k < chain_edge_count; ++k)
        {
          const ON_SubDVertex* v = chain[k].RelativeVertex(0);
          if (nullptr == v)
            break;
          const ON_SubDEdge* e = chain[k].Edge();
          if (nullptr == e)
            break;
          if (
            bSmooth != e->IsSmooth()
            || (bSmooth && v->IsCreaseOrCorner())
            )
          {
            // shift chain[] so it begins at chain[k];
            ON_SimpleArray<ON_SubDEdgePtr> tail;
            tail.Append(k, chain.Array());
            for (unsigned n = k; n < chain_edge_count; ++n)
              chain[n - k] = chain[n];
            chain.SetCount(chain_edge_count - k);
            chain.Append(tail.Count(), tail.Array());
            break;
          }
        }
        break;
      }
#ifdef ON_DEBUG
      unsigned temp_chain_edge_count{chain_edge_count};
      ON_2udex temp_udex{0U, (unsigned)(chain_edge_count - 1)};
      if (!Internal_VerifyEdgeChain(chain, temp_udex, &temp_chain_edge_count)) {
        temp_chain_edge_count = 0;
      }
      Internal_UnrollChain(chain);
#endif
      if (chain.UnsignedCount() >= minimum_chain_length) {
        const ON_SubDVertex* c0{chain[0].RelativeVertex(0)};
        const ON_SubDVertex* s1{sorted_edges.Last() == nullptr
                                    ? nullptr
                                    : sorted_edges.Last()->RelativeVertex(1)};
        if (c0 != nullptr && c0 == s1) {
          // If the first vertex of the chain is a corner, or a vertex with more
          // than 2 edges referencing it, we might have artificially split the
          // chain at that vertex and the last vertex of the previous chain is
          // the same as ours. Try a few tricks to put a gap between these two
          // vertices.
          const ON_SubDVertex* c1{
              chain[chain_edge_count - 1].RelativeVertex(1)};
          const ON_SubDVertex* s0{
              sorted_edges.First() == nullptr
                  ? nullptr
                  : sorted_edges.First()->RelativeVertex(0)};
          // By order of importance, try to:
          //   - Keep the orientation of the first edge the same as in unsorted_edges
          //   - Not use ReverseEdgeChain()
          //   - Append rather than Prepend to sorted_edges
          if (c1 != s0) {
            ++chain_count;
            sorted_edges.Prepend(chain.Count(), chain.Array());
          } else if (c1 != s1 && !bClosedChain &&
                     ((bFirstEdgeIsReversed && !bLastEdgeIsReversed) ||
                      (!bFirstEdgeIsReversed && bLastEdgeIsReversed))) {
            ReverseEdgeChain(chain);
            ++chain_count;
            sorted_edges.Append(chain.Count(), chain.Array());
          } else if (c0 != s0 && !bClosedChain &&
                     ((bFirstEdgeIsReversed && !bLastEdgeIsReversed) ||
                      (!bFirstEdgeIsReversed && bLastEdgeIsReversed))) {
            ReverseEdgeChain(chain);
            ++chain_count;
            sorted_edges.Prepend(chain.Count(), chain.Array());
          } else if (c1 != s1 && !bClosedChain) {
            ReverseEdgeChain(chain);
            ++chain_count;
            sorted_edges.Append(chain.Count(), chain.Array());
          } else if (c0 != s0 && !bClosedChain) {
            ReverseEdgeChain(chain);
            ++chain_count;
            sorted_edges.Prepend(chain.Count(), chain.Array());
          } else {
            // We tried, but nothing works easily enough: append the chain as
            // usual, this means the two chains are merged and chain_count does
            // not increase.
            sorted_edges.Append(chain.Count(), chain.Array());
          }
        } else {
          ++chain_count;
          sorted_edges.Append(chain.Count(), chain.Array());
        }
      }
    }

    if ( link_count == 2*sorted_edges.UnsignedCount() )
      break; // we've used all the links - no need to "skip over the rest".
  }
#ifdef ON_DEBUG
  Internal_UnrollChain(sorted_edges);
  if (!Internal_CountAndVerifyEdgeChains(sorted_edges, &chain_count)) {
    return chain_count;
  }
#endif
  return chain_count;
}